

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

void __thiscall
llvm::SmallVector<llvm::DWARFDebugNames::NameIndex,_0U>::~SmallVector
          (SmallVector<llvm::DWARFDebugNames::NameIndex,_0U> *this)

{
  NameIndex *S;
  SmallVector<llvm::DWARFDebugNames::NameIndex,_0U> *__ptr;
  
  S = (NameIndex *)
      (this->super_SmallVectorImpl<llvm::DWARFDebugNames::NameIndex>).
      super_SmallVectorTemplateBase<llvm::DWARFDebugNames::NameIndex,_false>.
      super_SmallVectorTemplateCommon<llvm::DWARFDebugNames::NameIndex,_void>.super_SmallVectorBase.
      BeginX;
  SmallVectorTemplateBase<llvm::DWARFDebugNames::NameIndex,_false>::destroy_range
            (S,S + (this->super_SmallVectorImpl<llvm::DWARFDebugNames::NameIndex>).
                   super_SmallVectorTemplateBase<llvm::DWARFDebugNames::NameIndex,_false>.
                   super_SmallVectorTemplateCommon<llvm::DWARFDebugNames::NameIndex,_void>.
                   super_SmallVectorBase.Size);
  __ptr = (SmallVector<llvm::DWARFDebugNames::NameIndex,_0U> *)
          (this->super_SmallVectorImpl<llvm::DWARFDebugNames::NameIndex>).
          super_SmallVectorTemplateBase<llvm::DWARFDebugNames::NameIndex,_false>.
          super_SmallVectorTemplateCommon<llvm::DWARFDebugNames::NameIndex,_void>.
          super_SmallVectorBase.BeginX;
  if (__ptr != this + 1) {
    free(__ptr);
    return;
  }
  return;
}

Assistant:

~SmallVector() {
    // Destroy the constructed elements in the vector.
    this->destroy_range(this->begin(), this->end());
  }